

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLCh *pXVar1;
  XMLAttr *this_00;
  XMLAttr *oneAttr;
  XMLSize_t i;
  XMLSize_t attrCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *attrList_local;
  XMLElementDecl *elemDecl_local;
  XSDDOMParser *this_local;
  
  XMLBuffer::append(&this->fAnnotationBuf,L'<');
  pXVar1 = XMLElementDecl::getFullName(elemDecl);
  XMLBuffer::append(&this->fAnnotationBuf,pXVar1);
  for (oneAttr = (XMLAttr *)0x0; oneAttr < attrCount; oneAttr = (XMLAttr *)&oneAttr->field_0x1) {
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,(XMLSize_t)oneAttr);
    XMLBuffer::append(&this->fAnnotationBuf,L' ');
    pXVar1 = XMLAttr::getQName(this_00);
    XMLBuffer::append(&this->fAnnotationBuf,pXVar1);
    XMLBuffer::append(&this->fAnnotationBuf,L'=');
    XMLBuffer::append(&this->fAnnotationBuf,L'\"');
    pXVar1 = XMLAttr::getValue(this_00);
    XMLBuffer::append(&this->fAnnotationBuf,pXVar1);
    XMLBuffer::append(&this->fAnnotationBuf,L'\"');
  }
  XMLBuffer::append(&this->fAnnotationBuf,L'>');
  return;
}

Assistant:

void XSDDOMParser::startAnnotationElement( const XMLElementDecl&       elemDecl
                                         , const RefVectorOf<XMLAttr>& attrList
                                         , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
    fAnnotationBuf.append(elemDecl.getFullName());
    //fAnnotationBuf.append(chSpace);

    for(XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttr = attrList.elementAt(i);
        fAnnotationBuf.append(chSpace);
        fAnnotationBuf.append(oneAttr ->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(oneAttr->getValue());
        fAnnotationBuf.append(chDoubleQuote);
    }

    fAnnotationBuf.append(chCloseAngle);
}